

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

void PaAlsaStream_Terminate(PaAlsaStream *self)

{
  long in_RDI;
  int __pa_assert_error_id;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  if (*(long *)(in_RDI + 0x2c0) != 0) {
    PaAlsaStreamComponent_Terminate((PaAlsaStreamComponent *)0x118849);
  }
  if (*(long *)(in_RDI + 0x340) != 0) {
    PaAlsaStreamComponent_Terminate((PaAlsaStreamComponent *)0x118869);
  }
  PaUtil_FreeMemory((void *)0x11887a);
  PaUnixMutex_Terminate
            ((PaUnixMutex *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  PaUtil_FreeMemory((void *)0x118899);
  return;
}

Assistant:

static void PaAlsaStream_Terminate( PaAlsaStream *self )
{
    assert( self );

    if( self->capture.pcm )
    {
        PaAlsaStreamComponent_Terminate( &self->capture );
    }
    if( self->playback.pcm )
    {
        PaAlsaStreamComponent_Terminate( &self->playback );
    }

    PaUtil_FreeMemory( self->pfds );
    ASSERT_CALL_( PaUnixMutex_Terminate( &self->stateMtx ), paNoError );

    PaUtil_FreeMemory( self );
}